

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall sznet::TimerQueue::expiredProcess(TimerQueue *this,Timestamp now)

{
  MinHeap<sznet::Timer> *this_00;
  TimerCallback *pTVar1;
  uint uVar2;
  EventLoop *this_01;
  size_t sVar3;
  _Manager_type p_Var4;
  bool bVar5;
  ulong uVar6;
  int64_t iVar7;
  int64_t iVar8;
  Timer *this_02;
  pair<std::_Rb_tree_iterator<std::pair<sznet::Timer_*,_long>_>,_std::_Rb_tree_iterator<std::pair<sznet::Timer_*,_long>_>_>
  pVar9;
  undefined1 local_50 [8];
  ActiveTimer activeTimer;
  Timestamp now_local;
  
  this_01 = this->m_loop;
  activeTimer.second = now.m_microSecondsSinceEpoch;
  bVar5 = net::EventLoop::isInLoopThread(this_01);
  if (!bVar5) {
    net::EventLoop::abortNotInLoopThread(this_01);
  }
  uVar2 = (this->m_timerMinHeap).m_size;
  uVar6 = (ulong)uVar2;
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count != uVar6) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x62,"void sznet::TimerQueue::expiredProcess(Timestamp)");
  }
  if (uVar2 != 0) {
    this_00 = &this->m_timerMinHeap;
    this_02 = *this_00->m_ptrArr;
    if (this_02 != (Timer *)0x0) {
      do {
        local_50 = (undefined1  [8])(this_02->m_expiration).m_microSecondsSinceEpoch;
        iVar7 = Timestamp::microSecondsSinceEpoch((Timestamp *)local_50);
        iVar8 = Timestamp::microSecondsSinceEpoch((Timestamp *)&activeTimer.second);
        if (iVar8 < iVar7) {
          uVar6 = (ulong)(this->m_timerMinHeap).m_size;
          break;
        }
        activeTimer.first = (Timer *)this_02->m_sequence;
        local_50 = (undefined1  [8])this_02;
        MinHeap<sznet::Timer>::pop(this_00);
        pVar9 = std::
                _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
                ::equal_range(&(this->m_activeTimers)._M_t,(key_type *)local_50);
        sVar3 = (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::
        _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
        ::_M_erase_aux(&(this->m_activeTimers)._M_t,(_Base_ptr)pVar9.first._M_node,
                       (_Base_ptr)pVar9.second._M_node);
        if (sVar3 - (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
          __assert_fail("n == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                        ,0x71,"void sznet::TimerQueue::expiredProcess(Timestamp)");
        }
        if ((this_02->m_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        pTVar1 = &this_02->m_callback;
        (*(this_02->m_callback)._M_invoker)((_Any_data *)pTVar1);
        if (this_02->m_repeat == true) {
          Timer::restart(this_02,(Timestamp)activeTimer.second);
          addTimerInLoop(this,this_02);
        }
        else {
          p_Var4 = (this_02->m_callback).super__Function_base._M_manager;
          if (p_Var4 != (_Manager_type)0x0) {
            (*p_Var4)((_Any_data *)pTVar1,(_Any_data *)pTVar1,__destroy_functor);
          }
          operator_delete(this_02);
        }
        uVar2 = (this->m_timerMinHeap).m_size;
        uVar6 = (ulong)uVar2;
        if (uVar2 == 0) {
          uVar6 = 0;
          break;
        }
        this_02 = *this_00->m_ptrArr;
      } while (this_02 != (Timer *)0x0);
    }
    if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count != uVar6) {
      __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                    ,0x7e,"void sznet::TimerQueue::expiredProcess(Timestamp)");
    }
  }
  return;
}

Assistant:

void TimerQueue::expiredProcess(Timestamp now)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.top();
		if (!timer)
		{
			break;
		}
		if (timer->expiration().microSecondsSinceEpoch() > now.microSecondsSinceEpoch())
		{
			break;
		}
		ActiveTimer activeTimer(timer, timer->sequence());
		m_timerMinHeap.pop();
		size_t n = m_activeTimers.erase(activeTimer);
		assert(n == 1); (void)n;
		timer->run();
		if (timer->repeat())
		{
			timer->restart(now);
			addTimerInLoop(timer);
		}
		else 
		{
			delete timer;
			timer = nullptr;
		}
	}
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}